

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueueTest.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  thread *thread;
  Test *args;
  int iVar2;
  uint64_t i;
  uint64_t i_1;
  atomic<bool> flag;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  atomic<unsigned_long> sum;
  MPMCQueue<TestType> q;
  TestType t;
  int local_1e0 [8];
  Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_> local_1c0;
  TestType local_100;
  
  rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::Queue
            (&local_1c0,0xb,(allocator<rigtorp::mpmc::Slot<TestType>_> *)&local_100);
  if ((local_1c0.head_.super___atomic_base<unsigned_long>._M_i !=
       local_1c0.tail_.super___atomic_base<unsigned_long>._M_i) ||
     (local_1c0.head_.super___atomic_base<unsigned_long>._M_i !=
      local_1c0.tail_.super___atomic_base<unsigned_long>._M_i &&
      -1 < (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
           (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i)) {
    __assert_fail("q.size() == 0 && q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x4d,"int main(int, char **)");
  }
  iVar2 = 10;
  do {
    rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::emplace<>
              (&local_1c0);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  if (((long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
       (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i != 10) ||
     (local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
      local_1c0.tail_.super___atomic_base<unsigned_long>._M_i ||
      (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
      (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i < 0)) {
    __assert_fail("q.size() == 10 && !q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x51,"int main(int, char **)");
  }
  if (TestType::constructed._M_t._M_impl.super__Rb_tree_header._M_node_count != 10) {
    __assert_fail("TestType::constructed.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x52,"int main(int, char **)");
  }
  TestType::TestType(&local_100);
  rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::pop
            (&local_1c0,&local_100);
  if (((long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
       (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i != 9) ||
     (local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
      local_1c0.tail_.super___atomic_base<unsigned_long>._M_i ||
      (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
      (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i < 0)) {
    __assert_fail("q.size() == 9 && !q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x56,"int main(int, char **)");
  }
  if (TestType::constructed._M_t._M_impl.super__Rb_tree_header._M_node_count != 10) {
    __assert_fail("TestType::constructed.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x57,"int main(int, char **)");
  }
  rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::pop
            (&local_1c0,&local_100);
  rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::emplace<>
            (&local_1c0);
  if (((long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
       (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i != 9) ||
     (local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
      local_1c0.tail_.super___atomic_base<unsigned_long>._M_i ||
      (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
      (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i < 0)) {
    __assert_fail("q.size() == 9 && !q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x5b,"int main(int, char **)");
  }
  if (TestType::constructed._M_t._M_impl.super__Rb_tree_header._M_node_count != 10) {
    __assert_fail("TestType::constructed.size() == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x5c,"int main(int, char **)");
  }
  TestType::~TestType(&local_100);
  rigtorp::mpmc::Queue<TestType,_std::allocator<rigtorp::mpmc::Slot<TestType>_>_>::~Queue
            (&local_1c0);
  if (TestType::constructed._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __assert_fail("TestType::constructed.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x5e,"int main(int, char **)");
  }
  rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::Queue
            ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *)&local_1c0,1,
             (allocator<rigtorp::mpmc::Slot<int>_> *)&local_100);
  local_100.data._0_8_ = (ulong)(uint)local_100.data._4_4_ << 0x20;
  local_1e0[0] = 1;
  bVar1 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::try_emplace<int>
                    ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *)&local_1c0,local_1e0)
  ;
  if (!bVar1) {
    __assert_fail("q.try_push(1) == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,99,"int main(int, char **)");
  }
  if (((long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
       (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i != 1) ||
     (local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
      local_1c0.tail_.super___atomic_base<unsigned_long>._M_i ||
      (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
      (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i < 0)) {
    __assert_fail("q.size() == 1 && !q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,100,"int main(int, char **)");
  }
  local_1e0[0] = 2;
  bVar1 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::try_emplace<int>
                    ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *)&local_1c0,local_1e0)
  ;
  if (bVar1) {
    __assert_fail("q.try_push(2) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x65,"int main(int, char **)");
  }
  if (((long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
       (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i != 1) ||
     (local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
      local_1c0.tail_.super___atomic_base<unsigned_long>._M_i ||
      (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
      (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i < 0)) {
    __assert_fail("q.size() == 1 && !q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x66,"int main(int, char **)");
  }
  bVar1 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::try_pop
                    ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *)&local_1c0,
                     (int *)&local_100);
  if ((!bVar1) || (local_100.data._0_4_ != 1)) {
    __assert_fail("q.try_pop(t) == true && t == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x67,"int main(int, char **)");
  }
  if ((local_1c0.head_.super___atomic_base<unsigned_long>._M_i !=
       local_1c0.tail_.super___atomic_base<unsigned_long>._M_i) ||
     (local_1c0.head_.super___atomic_base<unsigned_long>._M_i !=
      local_1c0.tail_.super___atomic_base<unsigned_long>._M_i &&
      -1 < (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
           (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i)) {
    __assert_fail("q.size() == 0 && q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x68,"int main(int, char **)");
  }
  bVar1 = rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::try_pop
                    ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *)&local_1c0,
                     (int *)&local_100);
  if ((!bVar1) && (local_100.data._0_4_ == 1)) {
    if ((local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
         local_1c0.tail_.super___atomic_base<unsigned_long>._M_i) &&
       (local_1c0.head_.super___atomic_base<unsigned_long>._M_i ==
        local_1c0.tail_.super___atomic_base<unsigned_long>._M_i ||
        (long)local_1c0.head_.super___atomic_base<unsigned_long>._M_i -
        (long)local_1c0.tail_.super___atomic_base<unsigned_long>._M_i < 0)) {
      rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::~Queue
                ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *)&local_1c0);
      local_1c0.capacity_ = 0x10;
      local_1c0.head_.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
      local_1c0.tail_.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
      local_1c0.slots_ = (Slot<TestType> *)operator_new(0x440,0x40);
      args = (Test *)0x0;
      memset(local_1c0.slots_,0,0x400);
      rigtorp::mpmc::Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
      emplace<main::Test&>
                ((Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>> *)&local_1c0,
                 args);
      rigtorp::mpmc::Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
      try_emplace<main::Test&>
                ((Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>> *)&local_1c0,
                 args);
      rigtorp::mpmc::Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
      push<main::Test&,void>
                ((Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>> *)&local_1c0,
                 args);
      rigtorp::mpmc::Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>>::
      try_emplace<main::Test&>
                ((Queue<main::Test,std::allocator<rigtorp::mpmc::Slot<main::Test>>> *)&local_1c0,
                 args);
      rigtorp::mpmc::Queue<Test,_std::allocator<rigtorp::mpmc::Slot<Test>_>_>::push
                ((Queue<Test,_std::allocator<rigtorp::mpmc::Slot<Test>_>_> *)&local_1c0,args);
      rigtorp::mpmc::Queue<Test,_std::allocator<rigtorp::mpmc::Slot<Test>_>_>::try_push
                ((Queue<Test,_std::allocator<rigtorp::mpmc::Slot<Test>_>_> *)&local_1c0,args);
      rigtorp::mpmc::Queue<Test,_std::allocator<rigtorp::mpmc::Slot<Test>_>_>::~Queue
                ((Queue<Test,_std::allocator<rigtorp::mpmc::Slot<Test>_>_> *)&local_1c0);
      rigtorp::mpmc::
      Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
      ::Queue((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
               *)&local_1c0,0x10,
              (allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_> *)
              &local_100);
      local_100.data._0_8_ = operator_new(4);
      *(undefined4 *)local_100.data._0_8_ = 1;
      rigtorp::mpmc::
      Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
      ::emplace<std::unique_ptr<int,std::default_delete<int>>>
                ((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                  *)&local_1c0,(unique_ptr<int,_std::default_delete<int>_> *)&local_100);
      if ((undefined4 *)local_100.data._0_8_ != (undefined4 *)0x0) {
        operator_delete((void *)local_100.data._0_8_,4);
      }
      local_100.data._0_8_ = operator_new(4);
      *(undefined4 *)local_100.data._0_8_ = 1;
      rigtorp::mpmc::
      Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
      ::try_emplace<std::unique_ptr<int,std::default_delete<int>>>
                ((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                  *)&local_1c0,(unique_ptr<int,_std::default_delete<int>_> *)&local_100);
      if ((undefined4 *)local_100.data._0_8_ != (undefined4 *)0x0) {
        operator_delete((void *)local_100.data._0_8_,4);
      }
      local_100.data._0_8_ = operator_new(4);
      *(undefined4 *)local_100.data._0_8_ = 1;
      rigtorp::mpmc::
      Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
      ::emplace<std::unique_ptr<int,std::default_delete<int>>>
                ((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                  *)&local_1c0,(unique_ptr<int,_std::default_delete<int>_> *)&local_100);
      if ((undefined4 *)local_100.data._0_8_ != (undefined4 *)0x0) {
        operator_delete((void *)local_100.data._0_8_,4);
      }
      local_100.data._0_8_ = operator_new(4);
      *(undefined4 *)local_100.data._0_8_ = 1;
      rigtorp::mpmc::
      Queue<std::unique_ptr<int,std::default_delete<int>>,std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,std::default_delete<int>>>>>
      ::try_emplace<std::unique_ptr<int,std::default_delete<int>>>
                ((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                  *)&local_1c0,(unique_ptr<int,_std::default_delete<int>_> *)&local_100);
      if ((undefined4 *)local_100.data._0_8_ != (undefined4 *)0x0) {
        operator_delete((void *)local_100.data._0_8_,4);
      }
      rigtorp::mpmc::
      Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
      ::~Queue((Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                *)&local_1c0);
      rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::Queue
                ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *)&local_1c0,0,
                 (allocator<rigtorp::mpmc::Slot<int>_> *)&local_100);
      rigtorp::mpmc::Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_>::~Queue
                ((Queue<int,_std::allocator<rigtorp::mpmc::Slot<int>_>_> *)&local_1c0);
      __assert_fail("throws == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                    ,0x98,"int main(int, char **)");
    }
    __assert_fail("q.size() == 0 && q.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                  ,0x6a,"int main(int, char **)");
  }
  __assert_fail("q.try_pop(t) == false && t == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]MPMCQueue/src/MPMCQueueTest.cpp"
                ,0x69,"int main(int, char **)");
}

Assistant:

int main(int argc, char *argv[]) {
  (void)argc, (void)argv;

  using namespace rigtorp;

  {
    MPMCQueue<TestType> q(11);
    assert(q.size() == 0 && q.empty());
    for (int i = 0; i < 10; i++) {
      q.emplace();
    }
    assert(q.size() == 10 && !q.empty());
    assert(TestType::constructed.size() == 10);

    TestType t;
    q.pop(t);
    assert(q.size() == 9 && !q.empty());
    assert(TestType::constructed.size() == 10);

    q.pop(t);
    q.emplace();
    assert(q.size() == 9 && !q.empty());
    assert(TestType::constructed.size() == 10);
  }
  assert(TestType::constructed.size() == 0);

  {
    MPMCQueue<int> q(1);
    int t = 0;
    assert(q.try_push(1) == true);
    assert(q.size() == 1 && !q.empty());
    assert(q.try_push(2) == false);
    assert(q.size() == 1 && !q.empty());
    assert(q.try_pop(t) == true && t == 1);
    assert(q.size() == 0 && q.empty());
    assert(q.try_pop(t) == false && t == 1);
    assert(q.size() == 0 && q.empty());
  }

  // Copyable only type
  {
    struct Test {
      Test() {}
      Test(const Test &) noexcept {}
      Test &operator=(const Test &) noexcept { return *this; }
      Test(Test &&) = delete;
    };
    MPMCQueue<Test> q(16);
    // lvalue
    Test v;
    q.emplace(v);
    q.try_emplace(v);
    q.push(v);
    q.try_push(v);
    // xvalue
    q.push(Test());
    q.try_push(Test());
  }

  // Movable only type
  {
    MPMCQueue<std::unique_ptr<int>> q(16);
    // lvalue
    auto v = std::unique_ptr<int>(new int(1));
    // q.emplace(v);
    // q.try_emplace(v);
    // q.push(v);
    // q.try_push(v);
    // xvalue
    q.emplace(std::unique_ptr<int>(new int(1)));
    q.try_emplace(std::unique_ptr<int>(new int(1)));
    q.push(std::unique_ptr<int>(new int(1)));
    q.try_push(std::unique_ptr<int>(new int(1)));
  }

  {
    bool throws = false;
    try {
      MPMCQueue<int> q(0);
    } catch (std::exception &) {
      throws = true;
    }
    assert(throws == true);
  }

  // Fuzz test
  {
    const uint64_t numOps = 1000;
    const uint64_t numThreads = 10;
    MPMCQueue<uint64_t> q(numThreads);
    std::atomic<bool> flag(false);
    std::vector<std::thread> threads;
    std::atomic<uint64_t> sum(0);
    for (uint64_t i = 0; i < numThreads; ++i) {
      threads.push_back(std::thread([&, i] {
        while (!flag)
          ;
        for (auto j = i; j < numOps; j += numThreads) {
          q.push(j);
        }
      }));
    }
    for (uint64_t i = 0; i < numThreads; ++i) {
      threads.push_back(std::thread([&, i] {
        while (!flag)
          ;
        uint64_t threadSum = 0;
        for (auto j = i; j < numOps; j += numThreads) {
          uint64_t v;
          q.pop(v);
          threadSum += v;
        }
        sum += threadSum;
      }));
    }
    flag = true;
    for (auto &thread : threads) {
      thread.join();
    }
    assert(sum == numOps * (numOps - 1) / 2);
  }

  return 0;
}